

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int set_parameters_from_string(char **file_content,char *name)

{
  long lVar1;
  int iVar2;
  parset pVar3;
  char *local_180;
  int local_178;
  int local_174;
  int values_2 [4];
  int local_160;
  int values_1 [3];
  int values [6];
  int r;
  parset type;
  char ident [256];
  char *line;
  size_t line_no;
  char *name_local;
  char **file_content_local;
  
  line = (char *)0x0;
  if ((file_content == (char **)0x0) || (*file_content == (char *)0x0)) {
    file_content_local._4_4_ = 0;
  }
  else {
    line_no = (size_t)name;
    name_local = (char *)file_content;
    free(last_param_file);
    if (line_no == 0) {
      local_180 = (char *)0x0;
    }
    else {
      local_180 = strdup((char *)line_no);
    }
    last_param_file = local_180;
    lVar1 = (long)line * 8;
    line = line + 1;
    iVar2 = strncmp(*(char **)(name_local + lVar1),"## RNAfold parameter file v2.0",0x1e);
    if (iVar2 != 0) {
      vrna_message_warning
                (
                "Missing header line in file.\nMay be this file has not v2.0 format.\nUse INTERRUPT-key to stop."
                );
    }
    while( true ) {
      lVar1 = *(long *)(name_local + (long)line * 8);
      if (lVar1 == 0) break;
      line = line + 1;
      iVar2 = __isoc99_sscanf(lVar1,"# %255s",&r);
      if (iVar2 == 1) {
        pVar3 = gettype((char *)&r);
        switch(pVar3) {
        case QUIT:
          break;
        case S:
          rd_2dim((char **)name_local,(size_t *)&line,stack37[0],stack_dim,stack_shift);
          break;
        case S_H:
          rd_2dim((char **)name_local,(size_t *)&line,stackdH[0],stack_dim,stack_shift);
          break;
        case HP:
          rd_1dim((char **)name_local,(size_t *)&line,hairpin37,0x1f,0);
          break;
        case HP_H:
          rd_1dim((char **)name_local,(size_t *)&line,hairpindH,0x1f,0);
          break;
        case B:
          rd_1dim((char **)name_local,(size_t *)&line,bulge37,0x1f,0);
          break;
        case B_H:
          rd_1dim((char **)name_local,(size_t *)&line,bulgedH,0x1f,0);
          break;
        case IL:
          rd_1dim((char **)name_local,(size_t *)&line,internal_loop37,0x1f,0);
          break;
        case IL_H:
          rd_1dim((char **)name_local,(size_t *)&line,internal_loopdH,0x1f,0);
          break;
        case MMH:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatchH37,mismatch_dim,mismatch_shift
                 );
          break;
        case MMH_H:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatchHdH,mismatch_dim,mismatch_shift
                 );
          break;
        case MMI:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatchI37,mismatch_dim,mismatch_shift
                 );
          break;
        case MMI_H:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatchIdH,mismatch_dim,mismatch_shift
                 );
          break;
        case MMI1N:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatch1nI37,mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N_H:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatch1nIdH,mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatch23I37,mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23_H:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatch23IdH,mismatch_dim,
                  mismatch_shift);
          break;
        case MMM:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatchM37,mismatch_dim,mismatch_shift
                 );
          break;
        case MMM_H:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatchMdH,mismatch_dim,mismatch_shift
                 );
          break;
        case MME:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatchExt37,mismatch_dim,
                  mismatch_shift);
          break;
        case MME_H:
          rd_3dim((char **)name_local,(size_t *)&line,(int *)mismatchExtdH,mismatch_dim,
                  mismatch_shift);
          break;
        case D5:
          rd_2dim((char **)name_local,(size_t *)&line,dangle5_37[0],dangle_dim,dangle_shift);
          break;
        case D5_H:
          rd_2dim((char **)name_local,(size_t *)&line,dangle5_dH[0],dangle_dim,dangle_shift);
          break;
        case D3:
          rd_2dim((char **)name_local,(size_t *)&line,dangle3_37[0],dangle_dim,dangle_shift);
          break;
        case D3_H:
          rd_2dim((char **)name_local,(size_t *)&line,dangle3_dH[0],dangle_dim,dangle_shift);
          break;
        case INT11:
          rd_4dim((char **)name_local,(size_t *)&line,(int *)int11_37,int11_dim,int11_shift);
          break;
        case INT11_H:
          rd_4dim((char **)name_local,(size_t *)&line,(int *)int11_dH,int11_dim,int11_shift);
          break;
        case INT21:
          rd_5dim((char **)name_local,(size_t *)&line,(int *)int21_37,int21_dim,int21_shift);
          break;
        case INT21_H:
          rd_5dim((char **)name_local,(size_t *)&line,(int *)int21_dH,int21_dim,int21_shift);
          break;
        case INT22:
          rd_6dim_slice((char **)name_local,(size_t *)&line,(int *)int22_37,int22_dim,int22_shift,
                        int22_post);
          update_nst(int22_37);
          break;
        case INT22_H:
          rd_6dim_slice((char **)name_local,(size_t *)&line,(int *)int22_dH,int22_dim,int22_shift,
                        int22_post);
          update_nst(int22_dH);
          break;
        case ML:
          rd_1dim((char **)name_local,(size_t *)&line,values_1 + 1,6,0);
          ML_BASE37 = values_1[1];
          ML_BASEdH = values_1[2];
          ML_closing37 = values[0];
          ML_closingdH = values[1];
          ML_intern37 = values[2];
          ML_interndH = values[3];
          break;
        case TL:
          rd_Tetraloop37((char **)name_local,(size_t *)&line);
          break;
        case TRI:
          rd_Triloop37((char **)name_local,(size_t *)&line);
          break;
        case HEX:
          rd_Hexaloop37((char **)name_local,(size_t *)&line);
          break;
        case NIN:
          rd_1dim((char **)name_local,(size_t *)&line,values_2 + 3,3,0);
          ninio37 = values_2[3];
          niniodH = local_160;
          MAX_NINIO = values_1[0];
          break;
        case MISC:
          rd_1dim((char **)name_local,(size_t *)&line,&local_178,4,0);
          DuplexInit37 = local_178;
          DuplexInitdH = local_174;
          TerminalAU37 = values_2[0];
          TerminalAUdH = values_2[1];
          break;
        default:
          vrna_message_warning("read_epars: Unknown field identifier in `%s\'",lVar1);
        }
      }
    }
    line = line + 1;
    check_symmetry();
    file_content_local._4_4_ = 1;
  }
  return file_content_local._4_4_;
}

Assistant:

PRIVATE int
set_parameters_from_string(char       **file_content,
                           const char *name)
{
  size_t      line_no;
  char        *line, ident[256];
  enum parset type;
  int         r;

  line_no = 0;

  if ((!file_content) ||
      (!file_content[line_no]))
    return 0;

  /* store file name of parameter data set */
  free(last_param_file);
  last_param_file = (name) ? strdup(name) : NULL;
  // free(last_param_file);

  if (strncmp(file_content[line_no++], "## RNAfold parameter file v2.0", 30) != 0) {
    vrna_message_warning("Missing header line in file.\n"
                         "May be this file has not v2.0 format.\n"
                         "Use INTERRUPT-key to stop.");
  }

  while ((line = file_content[line_no++])) {
    r = sscanf(line, "# %255s", ident);
    if (r == 1) {
      type = gettype(ident);
      switch (type) {
        case QUIT:
          break;
        case S:
          rd_2dim(file_content, &line_no, &(stack37[0][0]), stack_dim, stack_shift);
          break;
        case S_H:
          rd_2dim(file_content, &line_no, &(stackdH[0][0]), stack_dim, stack_shift);
          break;
        case HP:
          rd_1dim(file_content, &line_no, &(hairpin37[0]), 31, 0);
          break;
        case HP_H:
          rd_1dim(file_content, &line_no, &(hairpindH[0]), 31, 0);
          break;
        case B:
          rd_1dim(file_content, &line_no, &(bulge37[0]), 31, 0);
          break;
        case B_H:
          rd_1dim(file_content, &line_no, &(bulgedH[0]), 31, 0);
          break;
        case IL:
          rd_1dim(file_content, &line_no, &(internal_loop37[0]), 31, 0);
          break;
        case IL_H:
          rd_1dim(file_content, &line_no, &(internal_loopdH[0]), 31, 0);
          break;
        case MME:
          rd_3dim(file_content, &line_no, &(mismatchExt37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MME_H:
          rd_3dim(file_content, &line_no, &(mismatchExtdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMH:
          rd_3dim(file_content, &line_no, &(mismatchH37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMH_H:
          rd_3dim(file_content, &line_no, &(mismatchHdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI:
          rd_3dim(file_content, &line_no, &(mismatchI37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI_H:
          rd_3dim(file_content, &line_no, &(mismatchIdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N:
          rd_3dim(file_content, &line_no, &(mismatch1nI37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N_H:
          rd_3dim(file_content, &line_no, &(mismatch1nIdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23:
          rd_3dim(file_content, &line_no, &(mismatch23I37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23_H:
          rd_3dim(file_content, &line_no, &(mismatch23IdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMM:
          rd_3dim(file_content, &line_no, &(mismatchM37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMM_H:
          rd_3dim(file_content, &line_no, &(mismatchMdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case INT11:
          rd_4dim(file_content, &line_no, &(int11_37[0][0][0][0]),
                  int11_dim,
                  int11_shift);
          break;
        case INT11_H:
          rd_4dim(file_content, &line_no, &(int11_dH[0][0][0][0]),
                  int11_dim,
                  int11_shift);
          break;
        case INT21:
          rd_5dim(file_content, &line_no, &(int21_37[0][0][0][0][0]),
                  int21_dim,
                  int21_shift);
          break;
        case INT21_H:
          rd_5dim(file_content, &line_no, &(int21_dH[0][0][0][0][0]),
                  int21_dim,
                  int21_shift);
          break;
        case INT22:
          rd_6dim_slice(file_content, &line_no, &(int22_37[0][0][0][0][0][0]),
                        int22_dim,
                        int22_shift,
                        int22_post);
          update_nst(int22_37);
          break;
        case INT22_H:
          rd_6dim_slice(file_content, &line_no, &(int22_dH[0][0][0][0][0][0]),
                        int22_dim,
                        int22_shift,
                        int22_post);
          update_nst(int22_dH);
          break;
        case D5:
          rd_2dim(file_content, &line_no, &(dangle5_37[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D5_H:
          rd_2dim(file_content, &line_no, &(dangle5_dH[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D3:
          rd_2dim(file_content, &line_no, &(dangle3_37[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D3_H:
          rd_2dim(file_content, &line_no, &(dangle3_dH[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case ML:
        {
          int values[6];
          rd_1dim(file_content, &line_no, &values[0], 6, 0);
          ML_BASE37     = values[0];
          ML_BASEdH     = values[1];
          ML_closing37  = values[2];
          ML_closingdH  = values[3];
          ML_intern37   = values[4];
          ML_interndH   = values[5];
        }
        break;
        case NIN:
        {
          int values[3];
          rd_1dim(file_content, &line_no, &values[0], 3, 0);
          ninio37   = values[0];
          niniodH   = values[1];
          MAX_NINIO = values[2];
        }
        break;
        case MISC:
        {
          int values[4];
          rd_1dim(file_content, &line_no, &values[0], 4, 0);
          DuplexInit37  = values[0];
          DuplexInitdH  = values[1];
          TerminalAU37  = values[2];
          TerminalAUdH  = values[3];
        }
        break;
        case TL:
          rd_Tetraloop37(file_content, &line_no);
          break;
        case TRI:
          rd_Triloop37(file_content, &line_no);
          break;
        case HEX:
          rd_Hexaloop37(file_content, &line_no);
          break;
        default:      /* do nothing but complain */
          vrna_message_warning("read_epars: Unknown field identifier in `%s'", line);
      }
    } /* else ignore line */
  }

  check_symmetry();
  return 1;
}